

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlAttrPtr xmlNewPropInternal(xmlNodePtr node,xmlNsPtr ns,xmlChar *name,xmlChar *value,int eatname)

{
  xmlDictPtr dict;
  int iVar1;
  xmlNodePtr attr;
  _xmlDoc *doc;
  xmlChar *pxVar2;
  xmlNodePtr pxVar3;
  _xmlNode *p_Var4;
  _xmlNode *p_Var5;
  xmlRegisterNodeFunc *pp_Var6;
  
  if ((node == (xmlNodePtr)0x0) || (node->type == XML_ELEMENT_NODE)) {
    attr = (xmlNodePtr)(*xmlMalloc)(0x68);
    if (attr != (xmlNodePtr)0x0) {
      attr->nsDef = (xmlNs *)0x0;
      attr->_private = (void *)0x0;
      *(undefined8 *)&attr->type = 0;
      attr->last = (_xmlNode *)0x0;
      attr->parent = (_xmlNode *)0x0;
      attr->content = (xmlChar *)0x0;
      attr->properties = (_xmlAttr *)0x0;
      attr->doc = (_xmlDoc *)0x0;
      attr->ns = (xmlNs *)0x0;
      attr->next = (_xmlNode *)0x0;
      attr->prev = (_xmlNode *)0x0;
      attr->name = (xmlChar *)0x0;
      attr->children = (_xmlNode *)0x0;
      attr->type = XML_ATTRIBUTE_NODE;
      attr->parent = node;
      if (node == (xmlNodePtr)0x0) {
        attr->ns = ns;
        doc = (_xmlDoc *)0x0;
        if (eatname == 0) goto LAB_00149dcf;
LAB_00149da3:
        attr->name = name;
      }
      else {
        doc = node->doc;
        attr->doc = doc;
        attr->ns = ns;
        if (eatname != 0) goto LAB_00149da3;
        if (doc == (_xmlDoc *)0x0) {
          doc = (_xmlDoc *)0x0;
LAB_00149dcf:
          pxVar2 = xmlStrdup(name);
        }
        else {
          if (doc->dict == (xmlDictPtr)0x0) goto LAB_00149dcf;
          pxVar2 = xmlDictLookup(doc->dict,name,-1);
        }
        attr->name = pxVar2;
        if (pxVar2 == (xmlChar *)0x0) goto LAB_00149e79;
      }
      if (value != (xmlChar *)0x0) {
        pxVar3 = xmlNewDocText(doc,value);
        attr->children = pxVar3;
        if (pxVar3 != (xmlNodePtr)0x0) {
          attr->last = (_xmlNode *)0x0;
          while (p_Var4 = pxVar3, p_Var4 != (_xmlNode *)0x0) {
            p_Var4->parent = attr;
            pxVar3 = p_Var4->next;
            if (p_Var4->next == (_xmlNode *)0x0) {
              attr->last = p_Var4;
              pxVar3 = p_Var4->next;
            }
          }
          if ((doc == (xmlDoc *)0x0) ||
             ((iVar1 = xmlIsID(doc,node,(xmlAttrPtr)attr), -1 < iVar1 &&
              ((iVar1 != 1 || (iVar1 = xmlAddIDSafe((xmlAttrPtr)attr,value), -1 < iVar1))))))
          goto LAB_00149e55;
        }
LAB_00149e79:
        xmlFreeProp((xmlAttrPtr)attr);
        return (xmlAttrPtr)0x0;
      }
LAB_00149e55:
      if (node != (xmlNodePtr)0x0) {
        p_Var4 = (_xmlNode *)node->properties;
        if ((_xmlNode *)node->properties == (_xmlNode *)0x0) {
          node->properties = (_xmlAttr *)attr;
        }
        else {
          do {
            p_Var5 = p_Var4;
            p_Var4 = p_Var5->next;
          } while (p_Var5->next != (_xmlNode *)0x0);
          p_Var5->next = attr;
          attr->prev = p_Var5;
        }
      }
      if (xmlRegisterCallbacks != 0) {
        pp_Var6 = __xmlRegisterNodeDefaultValue();
        if (*pp_Var6 != (xmlRegisterNodeFunc)0x0) {
          pp_Var6 = __xmlRegisterNodeDefaultValue();
          (**pp_Var6)(attr);
          return (xmlAttrPtr)attr;
        }
        return (xmlAttrPtr)attr;
      }
      return (xmlAttrPtr)attr;
    }
    if (eatname != 1) {
      return (xmlAttrPtr)0x0;
    }
    if (node == (xmlNodePtr)0x0) goto LAB_00149d85;
  }
  else if (eatname != 1) {
    return (xmlAttrPtr)0x0;
  }
  if (((node->doc != (_xmlDoc *)0x0) && (dict = node->doc->dict, dict != (xmlDictPtr)0x0)) &&
     (iVar1 = xmlDictOwns(dict,name), iVar1 != 0)) {
    return (xmlAttrPtr)0x0;
  }
LAB_00149d85:
  (*xmlFree)(name);
  return (xmlAttrPtr)0x0;
}

Assistant:

static xmlAttrPtr
xmlNewPropInternal(xmlNodePtr node, xmlNsPtr ns,
                   const xmlChar * name, const xmlChar * value,
                   int eatname)
{
    xmlAttrPtr cur;
    xmlDocPtr doc = NULL;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE)) {
        if ((eatname == 1) &&
	    ((node->doc == NULL) || (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        return (NULL);
    }

    /*
     * Allocate a new property and fill the fields.
     */
    cur = (xmlAttrPtr) xmlMalloc(sizeof(xmlAttr));
    if (cur == NULL) {
        if ((eatname == 1) &&
	    ((node == NULL) || (node->doc == NULL) ||
             (node->doc->dict == NULL) ||
	     (!(xmlDictOwns(node->doc->dict, name)))))
            xmlFree((xmlChar *) name);
        return (NULL);
    }
    memset(cur, 0, sizeof(xmlAttr));
    cur->type = XML_ATTRIBUTE_NODE;

    cur->parent = node;
    if (node != NULL) {
        doc = node->doc;
        cur->doc = doc;
    }
    cur->ns = ns;

    if (eatname == 0) {
        if ((doc != NULL) && (doc->dict != NULL))
            cur->name = (xmlChar *) xmlDictLookup(doc->dict, name, -1);
        else
            cur->name = xmlStrdup(name);
        if (cur->name == NULL)
            goto error;
    } else
        cur->name = name;

    if (value != NULL) {
        xmlNodePtr tmp;

        cur->children = xmlNewDocText(doc, value);
        if (cur->children == NULL)
            goto error;
        cur->last = NULL;
        tmp = cur->children;
        while (tmp != NULL) {
            tmp->parent = (xmlNodePtr) cur;
            if (tmp->next == NULL)
                cur->last = tmp;
            tmp = tmp->next;
        }

        if (doc != NULL) {
            int res = xmlIsID(doc, node, cur);

            if (res < 0)
                goto error;
            if ((res == 1) && (xmlAddIDSafe(cur, value) < 0))
                goto error;
        }
    }

    /*
     * Add it at the end to preserve parsing order ...
     */
    if (node != NULL) {
        if (node->properties == NULL) {
            node->properties = cur;
        } else {
            xmlAttrPtr prev = node->properties;

            while (prev->next != NULL)
                prev = prev->next;
            prev->next = cur;
            cur->prev = prev;
        }
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
        xmlRegisterNodeDefaultValue((xmlNodePtr) cur);
    return (cur);

error:
    xmlFreeProp(cur);
    return(NULL);
}